

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  Expression *args_1;
  InputDeclaration *args_2;
  ReadStream *pRVar2;
  
  if (*(Expression **)(__fn + 0x20) != (Expression *)0x0) {
    pMVar1 = this->newModule;
    args_1 = cloneExpression(this,*(Expression **)(__fn + 0x20));
    args_2 = getRemappedInput(this,*(InputDeclaration **)(__fn + 0x28));
    pRVar2 = PoolAllocator::
             allocate<soul::heart::ReadStream,soul::CodeLocation_const&,soul::heart::Expression&,soul::heart::InputDeclaration&>
                       (&pMVar1->allocator->pool,(CodeLocation *)(__fn + 8),args_1,args_2);
    return (int)pRVar2;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::ReadStream& clone (const heart::ReadStream& old)
    {
        return newModule.allocate<heart::ReadStream> (old.location,
                                                      cloneExpression (*old.target),
                                                      getRemappedInput (old.source));
    }